

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::ClearBuffer(PF_BufferMgr *this)

{
  int iVar1;
  RC RVar2;
  PF_BufPageDesc *pPVar3;
  int slot;
  
  if (this->first != -1) {
    pPVar3 = this->bufTable;
    slot = this->first;
    do {
      iVar1 = pPVar3[slot].next;
      if (pPVar3[slot].pinCount == 0) {
        RVar2 = PF_HashTable::Delete(&this->hashTable,pPVar3[slot].fd,pPVar3[slot].pageNum);
        if (RVar2 != 0) {
          return RVar2;
        }
        Unlink(this,slot);
        pPVar3 = this->bufTable;
        pPVar3[slot].next = this->free;
        this->free = slot;
      }
      slot = iVar1;
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

RC PF_BufferMgr::ClearBuffer()
{
   RC rc;

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      if (bufTable[slot].pinCount == 0)
         if ((rc = hashTable.Delete(bufTable[slot].fd,
               bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)) ||
            (rc = InsertFree(slot)))
         return (rc);
      slot = next;
   }

   return 0;
}